

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O0

uint __thiscall
tchecker::
array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,string *name,intvar_info_t *info)

{
  intvar_info_t *info_00;
  intvar_info_t *name_00;
  uint id_00;
  anon_class_8_1_8991fb9c local_50;
  function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::intvar_info_t_&)>
  local_48;
  uint local_24;
  intvar_info_t *piStack_20;
  uint id;
  intvar_info_t *info_local;
  string *name_local;
  array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  piStack_20 = info;
  info_local = (intvar_info_t *)name;
  name_local = (string *)this;
  id_00 = size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::declare(&this->
                     super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,name,info);
  name_00 = info_local;
  info_00 = piStack_20;
  local_50.this = this;
  local_24 = id_00;
  std::function<void(unsigned_int,std::__cxx11::string_const&,tchecker::intvar_info_t_const&)>::
  function<tchecker::array_variables_t<unsigned_int,tchecker::intvar_info_t,tchecker::index_t<unsigned_int,std::__cxx11::string>>::declare(std::__cxx11::string_const&,tchecker::intvar_info_t_const&)::_lambda(unsigned_int,std::__cxx11::string_const&,tchecker::intvar_info_t_const&)_1_,void>
            ((function<void(unsigned_int,std::__cxx11::string_const&,tchecker::intvar_info_t_const&)>
              *)&local_48,&local_50);
  declare_flattened_variable<unsigned_int,tchecker::intvar_info_t>
            (id_00,(string *)name_00,info_00,&local_48);
  std::
  function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::intvar_info_t_&)>
  ::~function(&local_48);
  return local_24;
}

Assistant:

ID declare(std::string const & name, INFO const & info)
  {
    ID id = tchecker::size_variables_t<ID, INFO, INDEX>::declare(name, info);
    tchecker::declare_flattened_variable<ID, INFO>(id, name, info,
                                                   [&](ID flat_id, std::string const & flat_name, INFO const & flat_info) {
                                                     _flattened_variables.declare(flat_id, flat_name, flat_info);
                                                   });
    return id;
  }